

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Prog * re2::Compiler::Compile(Regexp *re,bool reversed,int64 max_mem)

{
  Regexp *re_00;
  undefined8 this;
  bool bVar1;
  bool b;
  ParseFlags flags;
  int start;
  Frag FVar2;
  Frag FVar3;
  uint32 local_100;
  Frag unanchored;
  uint32 local_e8;
  Frag all;
  Frag f;
  bool is_anchor_end;
  bool is_anchor_start;
  Regexp *pRStack_c8;
  Regexp *sre;
  undefined1 local_b0 [8];
  Compiler c;
  int64 max_mem_local;
  bool reversed_local;
  Regexp *re_local;
  
  c._128_8_ = max_mem;
  Compiler((Compiler *)local_b0);
  flags = Regexp::parse_flags(re);
  Setup((Compiler *)local_b0,flags,c._128_8_,ANCHOR_BOTH);
  c.failed_ = reversed;
  pRStack_c8 = Regexp::Simplify(re);
  if (pRStack_c8 == (Regexp *)0x0) {
    re_local = (Regexp *)0x0;
  }
  else {
    bVar1 = IsAnchorStart(&stack0xffffffffffffff38,0);
    b = IsAnchorEnd(&stack0xffffffffffffff38,0);
    re_00 = pRStack_c8;
    Frag::Frag(&all);
    FVar2 = Regexp::Walker<re2::Frag>::WalkExponential
                      ((Walker<re2::Frag> *)local_b0,re_00,all,c.encoding_ * 2);
    Regexp::Decref(pRStack_c8);
    if (((byte)c.prog_ & 1) == 0) {
      c.failed_ = false;
      FVar3 = Match((Compiler *)local_b0,0);
      FVar2 = Cat((Compiler *)local_b0,FVar2,FVar3);
      local_e8 = FVar2.begin;
      Prog::set_start((Prog *)c.super_Walker<re2::Frag>._16_8_,local_e8);
      if (reversed) {
        Prog::set_anchor_start((Prog *)c.super_Walker<re2::Frag>._16_8_,b);
        Prog::set_anchor_end((Prog *)c.super_Walker<re2::Frag>._16_8_,bVar1);
      }
      else {
        Prog::set_anchor_start((Prog *)c.super_Walker<re2::Frag>._16_8_,bVar1);
        Prog::set_anchor_end((Prog *)c.super_Walker<re2::Frag>._16_8_,b);
      }
      bVar1 = Prog::anchor_start((Prog *)c.super_Walker<re2::Frag>._16_8_);
      this = c.super_Walker<re2::Frag>._16_8_;
      if (bVar1) {
        start = Prog::start((Prog *)c.super_Walker<re2::Frag>._16_8_);
        Prog::set_start_unanchored((Prog *)this,start);
      }
      else {
        FVar3 = DotStar((Compiler *)local_b0);
        FVar2 = Cat((Compiler *)local_b0,FVar3,FVar2);
        local_100 = FVar2.begin;
        Prog::set_start_unanchored((Prog *)c.super_Walker<re2::Frag>._16_8_,local_100);
      }
      Prog::set_reversed((Prog *)c.super_Walker<re2::Frag>._16_8_,reversed);
      re_local = (Regexp *)Finish((Compiler *)local_b0);
    }
    else {
      re_local = (Regexp *)0x0;
    }
  }
  ~Compiler((Compiler *)local_b0);
  return (Prog *)re_local;
}

Assistant:

Prog* Compiler::Compile(Regexp* re, bool reversed, int64 max_mem) {
  Compiler c;

  c.Setup(re->parse_flags(), max_mem, RE2::ANCHOR_BOTH /* unused */);
  c.reversed_ = reversed;

  // Simplify to remove things like counted repetitions
  // and character classes like \d.
  Regexp* sre = re->Simplify();
  if (sre == NULL)
    return NULL;

  // Record whether prog is anchored, removing the anchors.
  // (They get in the way of other optimizations.)
  bool is_anchor_start = IsAnchorStart(&sre, 0);
  bool is_anchor_end = IsAnchorEnd(&sre, 0);

  // Generate fragment for entire regexp.
  Frag f = c.WalkExponential(sre, Frag(), 2*c.max_inst_);
  sre->Decref();
  if (c.failed_)
    return NULL;

  // Success!  Finish by putting Match node at end, and record start.
  // Turn off c.reversed_ (if it is set) to force the remaining concatenations
  // to behave normally.
  c.reversed_ = false;
  Frag all = c.Cat(f, c.Match(0));
  c.prog_->set_start(all.begin);

  if (reversed) {
    c.prog_->set_anchor_start(is_anchor_end);
    c.prog_->set_anchor_end(is_anchor_start);
  } else {
    c.prog_->set_anchor_start(is_anchor_start);
    c.prog_->set_anchor_end(is_anchor_end);
  }

  // Also create unanchored version, which starts with a .*? loop.
  if (c.prog_->anchor_start()) {
    c.prog_->set_start_unanchored(c.prog_->start());
  } else {
    Frag unanchored = c.Cat(c.DotStar(), all);
    c.prog_->set_start_unanchored(unanchored.begin);
  }

  c.prog_->set_reversed(reversed);

  // Hand ownership of prog_ to caller.
  return c.Finish();
}